

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Tree::_free_list_add(Tree *this,size_t i)

{
  NodeData *pNVar1;
  size_t sVar2;
  code *pcVar3;
  Location LVar4;
  bool bVar5;
  char msg [36];
  char local_38 [40];
  
  if (this->m_cap <= i) {
    builtin_strncpy(local_38,"check failed: (i >= 0 && i < m_cap)",0x24);
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x638e) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x638e) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_38,0x24,LVar4,(this->m_callbacks).m_user_data);
  }
  pNVar1 = this->m_buf;
  pNVar1[i].m_parent = 0xffffffffffffffff;
  sVar2 = this->m_free_head;
  pNVar1[i].m_next_sibling = sVar2;
  pNVar1[i].m_prev_sibling = 0xffffffffffffffff;
  if (sVar2 != 0xffffffffffffffff) {
    pNVar1[sVar2].m_prev_sibling = i;
  }
  this->m_free_head = i;
  if (this->m_free_tail == 0xffffffffffffffff) {
    this->m_free_tail = i;
  }
  return;
}

Assistant:

void Tree::_free_list_add(size_t i)
{
    _RYML_CB_ASSERT(m_callbacks, i >= 0 && i < m_cap);
    NodeData &C4_RESTRICT w = m_buf[i];

    w.m_parent = NONE;
    w.m_next_sibling = m_free_head;
    w.m_prev_sibling = NONE;
    if(m_free_head != NONE)
        m_buf[m_free_head].m_prev_sibling = i;
    m_free_head = i;
    if(m_free_tail == NONE)
        m_free_tail = m_free_head;
}